

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O0

int EVP_sha256_final_with_secret_suffix
              (SHA256_CTX *ctx,uint8_t *out,uint8_t *in,size_t len,size_t max_len)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  crypto_word_t cVar7;
  crypto_word_t cVar8;
  ulong local_120;
  size_t i_1;
  size_t j_2;
  size_t j_1;
  crypto_word_t is_last_block;
  uint8_t is_padding_byte;
  uint8_t is_in_bounds;
  size_t idx;
  size_t j;
  size_t to_copy;
  size_t block_start;
  size_t i;
  size_t input_idx;
  uint32_t result [8];
  uint8_t block [64];
  uint8_t length_bytes [4];
  size_t total_bits;
  size_t max_blocks;
  size_t last_block;
  size_t num_blocks;
  size_t max_len_bits;
  size_t max_len_local;
  size_t len_local;
  uint8_t *in_local;
  uint8_t *out_local;
  SHA256_CTX *ctx_local;
  
  uVar5 = max_len * 8;
  if ((((ctx->Nh == 0) && ((max_len & 0x1fffffffffffffff) == max_len)) && (uVar5 <= ctx->Nl + uVar5)
      ) && (ctx->Nl + uVar5 < 0x100000000)) {
    uVar1 = ctx->num;
    uVar2 = ctx->num;
    lVar6 = (ulong)ctx->Nl + len * 8;
    block[0x3c] = (uint8_t)((ulong)lVar6 >> 0x18);
    block[0x3d] = (uint8_t)((ulong)lVar6 >> 0x10);
    block[0x3e] = (uint8_t)((ulong)lVar6 >> 8);
    block[0x3f] = (uint8_t)lVar6;
    memset(result + 6,0,0x40);
    memset(&input_idx,0,0x20);
    i = 0;
    for (block_start = 0; block_start < uVar2 + max_len + 0x48 >> 6; block_start = block_start + 1)
    {
      to_copy = 0;
      if (block_start == 0) {
        OPENSSL_memcpy(result + 6,ctx->data,(ulong)ctx->num);
        to_copy = (size_t)ctx->num;
      }
      if (i < max_len) {
        j = 0x40 - to_copy;
        if (max_len - i < j) {
          j = max_len - i;
        }
        OPENSSL_memcpy((void *)((long)result + to_copy + 0x18),in + i,j);
      }
      for (idx = to_copy; idx < 0x40; idx = idx + 1) {
        cVar7 = (i + idx) - to_copy;
        cVar8 = value_barrier_w(len);
        bVar3 = constant_time_lt_8(cVar7,cVar8);
        cVar8 = value_barrier_w(len);
        bVar4 = constant_time_eq_8(cVar7,cVar8);
        *(byte *)((long)result + idx + 0x18) = *(byte *)((long)result + idx + 0x18) & bVar3;
        *(byte *)((long)result + idx + 0x18) = *(byte *)((long)result + idx + 0x18) | bVar4 & 0x80;
      }
      i = (0x40 - to_copy) + i;
      cVar7 = constant_time_eq_w(block_start,(uVar1 + len + 0x48 >> 6) - 1);
      for (j_2 = 0; j_2 < 4; j_2 = j_2 + 1) {
        block[j_2 + 0x34] = block[j_2 + 0x34] | (byte)cVar7 & block[j_2 + 0x3c];
      }
      SHA256_Transform((SHA256_CTX *)ctx,(uchar *)(result + 6));
      for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
        result[i_1 - 2] = result[i_1 - 2] | (uint)cVar7 & ctx->h[i_1];
      }
    }
    for (local_120 = 0; local_120 < 8; local_120 = local_120 + 1) {
      CRYPTO_store_u32_be(out + local_120 * 4,result[local_120 - 2]);
    }
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int EVP_sha256_final_with_secret_suffix(SHA256_CTX *ctx,
                                        uint8_t out[SHA256_DIGEST_LENGTH],
                                        const uint8_t *in, size_t len,
                                        size_t max_len) {
  // Bound the input length so |total_bits| below fits in four bytes. This is
  // redundant with TLS record size limits. This also ensures |input_idx| below
  // does not overflow.
  size_t max_len_bits = max_len << 3;
  if (ctx->Nh != 0 ||
      (max_len_bits >> 3) != max_len ||  // Overflow
      ctx->Nl + max_len_bits < max_len_bits ||
      ctx->Nl + max_len_bits > UINT32_MAX) {
    return 0;
  }

  // We need to hash the following into |ctx|:
  //
  // - ctx->data[:ctx->num]
  // - in[:len]
  // - A 0x80 byte
  // - However many zero bytes are needed to pad up to a block.
  // - Eight bytes of length.
  size_t num_blocks = (ctx->num + len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;
  size_t last_block = num_blocks - 1;
  size_t max_blocks = (ctx->num + max_len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;

  // The bounds above imply |total_bits| fits in four bytes.
  size_t total_bits = ctx->Nl + (len << 3);
  uint8_t length_bytes[4];
  length_bytes[0] = (uint8_t)(total_bits >> 24);
  length_bytes[1] = (uint8_t)(total_bits >> 16);
  length_bytes[2] = (uint8_t)(total_bits >> 8);
  length_bytes[3] = (uint8_t)total_bits;

  // We now construct and process each expected block in constant-time.
  uint8_t block[SHA256_CBLOCK] = {0};
  uint32_t result[8] = {0};
  // input_idx is the index into |in| corresponding to the current block.
  // However, we allow this index to overflow beyond |max_len|, to simplify the
  // 0x80 byte.
  size_t input_idx = 0;
  for (size_t i = 0; i < max_blocks; i++) {
    // Fill |block| with data from the partial block in |ctx| and |in|. We copy
    // as if we were hashing up to |max_len| and then zero the excess later.
    size_t block_start = 0;
    if (i == 0) {
      OPENSSL_memcpy(block, ctx->data, ctx->num);
      block_start = ctx->num;
    }
    if (input_idx < max_len) {
      size_t to_copy = SHA256_CBLOCK - block_start;
      if (to_copy > max_len - input_idx) {
        to_copy = max_len - input_idx;
      }
      OPENSSL_memcpy(block + block_start, in + input_idx, to_copy);
    }

    // Zero any bytes beyond |len| and add the 0x80 byte.
    for (size_t j = block_start; j < SHA256_CBLOCK; j++) {
      // input[idx] corresponds to block[j].
      size_t idx = input_idx + j - block_start;
      // The barriers on |len| are not strictly necessary. However, without
      // them, GCC compiles this code by incorporating |len| into the loop
      // counter and subtracting it out later. This is still constant-time, but
      // it frustrates attempts to validate this.
      uint8_t is_in_bounds = constant_time_lt_8(idx, value_barrier_w(len));
      uint8_t is_padding_byte = constant_time_eq_8(idx, value_barrier_w(len));
      block[j] &= is_in_bounds;
      block[j] |= 0x80 & is_padding_byte;
    }

    input_idx += SHA256_CBLOCK - block_start;

    // Fill in the length if this is the last block.
    crypto_word_t is_last_block = constant_time_eq_w(i, last_block);
    for (size_t j = 0; j < 4; j++) {
      block[SHA256_CBLOCK - 4 + j] |= is_last_block & length_bytes[j];
    }

    // Process the block and save the hash state if it is the final value.
    SHA256_Transform(ctx, block);
    for (size_t j = 0; j < 8; j++) {
      result[j] |= is_last_block & ctx->h[j];
    }
  }

  // Write the output.
  for (size_t i = 0; i < 8; i++) {
    CRYPTO_store_u32_be(out + 4 * i, result[i]);
  }
  return 1;
}